

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteTest.h
# Opt level: O3

void UnitTest::
     ExecuteTest<(anonymous_namespace)::TestRunnerFixtureTestFinishIsReportedCorrectlyHelper>
               (TestRunnerFixtureTestFinishIsReportedCorrectlyHelper *testObject,
               TestDetails *details)

{
  TestList *this;
  TestResults *pTVar1;
  int iVar2;
  TestDetails **ppTVar3;
  TestResults **ppTVar4;
  undefined8 *puVar5;
  MockTest test;
  SignalTranslator sig;
  int local_4ec;
  TestDetails local_4e8;
  Test local_4c8;
  SignalTranslator local_490;
  
  ppTVar3 = CurrentTest::Details();
  *ppTVar3 = details;
  SignalTranslator::SignalTranslator(&local_490);
  iVar2 = __sigsetjmp(SignalTranslator::s_jumpTarget,1);
  if (iVar2 == 0) {
    Test::Test(&local_4c8,"goodtest","DefaultSuite","",0);
    local_4c8._vptr_Test = (_func_int **)&PTR__Test_00151f40;
    local_4c8._49_2_ = 1;
    local_4c8._52_4_ = 1;
    this = &(testObject->super_TestRunnerFixture).list;
    TestList::Add(this,&local_4c8);
    TestRunner::RunTestsIf<UnitTest::True>
              (&(testObject->super_TestRunnerFixture).runner,this,(char *)0x0,(True *)&local_4e8,0);
    ppTVar4 = CurrentTest::Results();
    pTVar1 = *ppTVar4;
    local_4ec = 1;
    ppTVar3 = CurrentTest::Details();
    TestDetails::TestDetails(&local_4e8,*ppTVar3,0x44);
    CheckEqual<int,int>(pTVar1,&local_4ec,
                        &(testObject->super_TestRunnerFixture).reporter.testFinishedCount,&local_4e8
                       );
    ppTVar4 = CurrentTest::Results();
    pTVar1 = *ppTVar4;
    ppTVar3 = CurrentTest::Details();
    TestDetails::TestDetails(&local_4e8,*ppTVar3,0x45);
    CheckEqual(pTVar1,"goodtest",(testObject->super_TestRunnerFixture).reporter.lastFinishedTest,
               &local_4e8);
    Test::~Test(&local_4c8);
    SignalTranslator::~SignalTranslator(&local_490);
    return;
  }
  puVar5 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar5 = "Unhandled system exception";
  __cxa_throw(puVar5,&char_const*::typeinfo,0);
}

Assistant:

void ExecuteTest(T& testObject, TestDetails const& details)
{
	CurrentTest::Details() = &details;

	try
	{
#ifdef UNITTEST_POSIX
		UNITTEST_THROW_SIGNALS
#endif
		testObject.RunImpl();
	}
	catch (AssertException const& e)
	{
		CurrentTest::Results()->OnTestFailure(
			TestDetails(details.testName, details.suiteName, e.Filename(), e.LineNumber()), e.what());
	}
	catch (std::exception const& e)
	{
		MemoryOutStream stream;
		stream << "Unhandled exception: " << e.what();
		CurrentTest::Results()->OnTestFailure(details, stream.GetText());
	}
	catch (...)
	{
		CurrentTest::Results()->OnTestFailure(details, "Unhandled exception: Crash!");
	}
}